

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void Curl_cpool_prune_dead(Curl_easy *data)

{
  Curl_share *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  timediff_t tVar5;
  cpool *cpool;
  curltime cVar6;
  curltime older;
  time_t local_38;
  int iStack_30;
  undefined4 uStack_2c;
  
  if (data == (Curl_easy *)0x0) {
    cpool = (cpool *)0x0;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      if (data->multi_easy == (Curl_multi *)0x0) {
        cpool = &data->multi->cpool;
        if (data->multi == (Curl_multi *)0x0) {
          cpool = (cpool *)0x0;
        }
      }
      else {
        cpool = &data->multi_easy->cpool;
      }
    }
    else {
      cpool = &pCVar1->cpool;
    }
  }
  if (cpool != (cpool *)0x0) {
    cVar6 = Curl_now();
    local_38 = cVar6.tv_sec;
    iStack_30 = cVar6.tv_usec;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 | 1;
    cVar6.tv_usec = iStack_30;
    cVar6.tv_sec = local_38;
    uVar2 = (cpool->last_cleanup).tv_sec;
    uVar3 = (cpool->last_cleanup).tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    cVar6._12_4_ = 0;
    older._12_4_ = 0;
    tVar5 = Curl_timediff(cVar6,older);
    if (999 < tVar5) {
      do {
        _Var4 = cpool_foreach(data,cpool,&local_38,cpool_reap_dead_cb);
      } while (_Var4);
      (cpool->last_cleanup).tv_sec = local_38;
      *(ulong *)&(cpool->last_cleanup).tv_usec = CONCAT44(uStack_2c,iStack_30);
    }
    cpool->field_0x98 = cpool->field_0x98 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_prune_dead(struct Curl_easy *data)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_reaper_ctx rctx;
  timediff_t elapsed;

  if(!cpool)
    return;

  rctx.now = Curl_now();
  CPOOL_LOCK(cpool);
  elapsed = Curl_timediff(rctx.now, cpool->last_cleanup);

  if(elapsed >= 1000L) {
    while(cpool_foreach(data, cpool, &rctx, cpool_reap_dead_cb))
      ;
    cpool->last_cleanup = rctx.now;
  }
  CPOOL_UNLOCK(cpool);
}